

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# take_at_most_iterator.hpp
# Opt level: O0

take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_int> * __thiscall
burst::make_take_at_most_iterator<std::forward_list<int,std::allocator<int>>const&,int>
          (take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_int> *__return_storage_ptr__,
          burst *this,forward_list<int,_std::allocator<int>_> *r,int n)

{
  const_iterator first;
  const_iterator last;
  int n_local;
  forward_list<int,_std::allocator<int>_> *r_local;
  
  first = std::begin<std::forward_list<int,std::allocator<int>>>
                    ((forward_list<int,_std::allocator<int>_> *)this);
  last = std::end<std::forward_list<int,std::allocator<int>>>
                   ((forward_list<int,_std::allocator<int>_> *)this);
  take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_int>::take_at_most_iterator
            (__return_storage_ptr__,(_Fwd_list_const_iterator<int>)first._M_node,
             (_Fwd_list_const_iterator<int>)last._M_node,(int)r);
  return __return_storage_ptr__;
}

Assistant:

auto make_take_at_most_iterator (Range && r, Integer n)
    {
        using iterator = range_iterator_t<Range>;
        using std::begin;
        using std::end;
        return
            take_at_most_iterator<iterator, Integer>
            (
                begin(std::forward<Range>(r)),
                end(std::forward<Range>(r)),
                n
            );
    }